

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O3

void xc_func_end(xc_func_type *func)

{
  _func_void_xc_func_type_ptr *p_Var1;
  int ii;
  long lVar2;
  
  p_Var1 = func->info->end;
  if (p_Var1 != (_func_void_xc_func_type_ptr *)0x0) {
    (*p_Var1)(func);
  }
  if (0 < func->n_func_aux) {
    lVar2 = 0;
    do {
      xc_func_end(func->func_aux[lVar2]);
      libxc_free(func->func_aux[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < func->n_func_aux);
    libxc_free(func->func_aux);
  }
  if (func->mix_coef != (double *)0x0) {
    libxc_free(func->mix_coef);
  }
  if (func->ext_params != (double *)0x0) {
    libxc_free(func->ext_params);
  }
  if (func->params != (void *)0x0) {
    libxc_free(func->params);
  }
  libxc_free(func->info);
  func->info = (xc_func_info_type *)0x0;
  func->nspin = 1;
  func->nlc_b = 0.0;
  func->nlc_C = 0.0;
  *(undefined8 *)((long)&func->cam_alpha + 4) = 0;
  *(undefined8 *)((long)&func->cam_beta + 4) = 0;
  *(undefined8 *)((long)&func->mix_coef + 4) = 0;
  *(undefined8 *)((long)&func->cam_omega + 4) = 0;
  *(undefined8 *)&func->n_func_aux = 0;
  *(undefined8 *)((long)&func->func_aux + 4) = 0;
  func->sigma_threshold = 0.0;
  func->tau_threshold = 0.0;
  func->dens_threshold = 0.0;
  func->zeta_threshold = 0.0;
  func->ext_params = (double *)0x0;
  func->params = (void *)0x0;
  return;
}

Assistant:

void xc_func_end(xc_func_type *func)
{
  assert(func != NULL && func->info != NULL);

  /* call internal termination routine */
  if(func->info->end != NULL)
    func->info->end(func);

  /* terminate any auxiliary functional */
  if(func->n_func_aux > 0){
    int ii;

    for(ii=0; ii<func->n_func_aux; ii++){
      xc_func_end(func->func_aux[ii]);
      libxc_free(func->func_aux[ii]);
    }
    libxc_free(func->func_aux);
  }

  /* deallocate coefficients for mixed functionals */
  if(func->mix_coef != NULL)
    libxc_free(func->mix_coef);

  /* deallocate any used parameter */
  if(func->ext_params != NULL)
    libxc_free(func->ext_params);
  if(func->params != NULL)
    libxc_free(func->params);

  libxc_free((void *) func->info);

  xc_func_nullify(func);
}